

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_mgr.cxx
# Opt level: O2

int nuraft::nuraft_global_mgr::init(EVP_PKEY_CTX *ctx)

{
  size_t sVar1;
  bool bVar2;
  ngm_singleton *pnVar3;
  _Head_base<0UL,_nuraft::nuraft_global_mgr_*,_false> this;
  
  pnVar3 = ngm_singleton::get_instance();
  this._M_head_impl =
       (pnVar3->internal_)._M_t.
       super___uniq_ptr_impl<nuraft::nuraft_global_mgr,_std::default_delete<nuraft::nuraft_global_mgr>_>
       ._M_t.
       super__Tuple_impl<0UL,_nuraft::nuraft_global_mgr_*,_std::default_delete<nuraft::nuraft_global_mgr>_>
       .super__Head_base<0UL,_nuraft::nuraft_global_mgr_*,_false>._M_head_impl;
  if (this._M_head_impl == (nuraft_global_mgr *)0x0) {
    pnVar3 = ngm_singleton::get_instance();
    bVar2 = ngm_singleton::create(pnVar3);
    pnVar3 = ngm_singleton::get_instance();
    this._M_head_impl =
         (pnVar3->internal_)._M_t.
         super___uniq_ptr_impl<nuraft::nuraft_global_mgr,_std::default_delete<nuraft::nuraft_global_mgr>_>
         ._M_t.
         super__Tuple_impl<0UL,_nuraft::nuraft_global_mgr_*,_std::default_delete<nuraft::nuraft_global_mgr>_>
         .super__Head_base<0UL,_nuraft::nuraft_global_mgr_*,_false>._M_head_impl;
    if (bVar2) {
      *(size_t *)((long)&(this._M_head_impl)->config_ + 0x10) = *(size_t *)(ctx + 0x10);
      sVar1 = *(size_t *)(ctx + 8);
      ((this._M_head_impl)->config_).num_commit_threads_ = *(size_t *)ctx;
      *(size_t *)((long)&(this._M_head_impl)->config_ + 8) = sVar1;
      init_thread_pool(this._M_head_impl);
    }
  }
  return (int)this._M_head_impl;
}

Assistant:

nuraft_global_mgr* nuraft_global_mgr::init(const nuraft_global_config& config) {
    nuraft_global_mgr* mgr = ngm_singleton::get_instance().get();
    if (!mgr) {
        bool created = ngm_singleton::get_instance().create();
        mgr = ngm_singleton::get_instance().get();
        if (created) {
            mgr->config_ = config;
            mgr->init_thread_pool();
        }
    }
    return mgr;
}